

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlGrowNsCache(xmlNsCache **cache,int *capacity)

{
  int iVar1;
  xmlNsCache *pxVar2;
  int newSize;
  xmlNsCache *tmp;
  int *capacity_local;
  xmlNsCache **cache_local;
  
  iVar1 = xmlGrowCapacity(*capacity,0x10,10,1000000000);
  if (iVar1 < 0) {
    cache_local._4_4_ = -1;
  }
  else {
    pxVar2 = (xmlNsCache *)(*xmlRealloc)(*cache,(long)iVar1 << 4);
    if (pxVar2 == (xmlNsCache *)0x0) {
      cache_local._4_4_ = -1;
    }
    else {
      *cache = pxVar2;
      *capacity = iVar1;
      cache_local._4_4_ = 0;
    }
  }
  return cache_local._4_4_;
}

Assistant:

static int
xmlGrowNsCache(xmlNsCache **cache, int *capacity) {
    xmlNsCache *tmp;
    int newSize;

    newSize = xmlGrowCapacity(*capacity, sizeof(tmp[0]),
                              10, XML_MAX_ITEMS);
    if (newSize < 0)
        return(-1);
    tmp = xmlRealloc(*cache, newSize * sizeof(tmp[0]));
    if (tmp == NULL)
        return(-1);
    *cache = tmp;
    *capacity = newSize;

    return(0);
}